

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTest.h
# Opt level: O2

void __thiscall
oout::ContainTest::ContainTest<char_const*>
          (ContainTest *this,shared_ptr<const_oout::Text> *text,string *sub,char *subs)

{
  allocator<char> local_49;
  undefined1 local_48 [16];
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_48 + 0x10),subs,&local_49);
  std::make_shared<oout::ContainMatch,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  ContainTest<std::shared_ptr<oout::ContainMatch>>
            (this,text,(string *)(local_48 + 0x10),(shared_ptr<oout::ContainMatch> *)local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  return;
}

Assistant:

ContainTest(
		const std::shared_ptr<const Text> &text,
		const std::string &sub,
		S ... subs
	) : ContainTest(text, subs..., std::make_shared<ContainMatch>(sub))
	{
	}